

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

void __thiscall
ValidationCache::ValidationCache
          (ValidationCache *this,size_t script_execution_cache_bytes,size_t signature_cache_bytes)

{
  long lVar1;
  string_view source_file;
  string_view logging_function;
  uchar *puVar2;
  size_t in_RDX;
  char *in_RSI;
  LogFlags in_RDI;
  long in_FS_OFFSET;
  Level in_stack_00000070;
  unsigned_long *in_stack_00000080;
  unsigned_long *in_stack_00000088;
  uint *in_stack_00000090;
  type *approx_size_bytes;
  type *num_elems;
  uint256 nonce;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  char *in_stack_fffffffffffffee0;
  cache<uint256,_SignatureCacheHasher> *in_stack_fffffffffffffee8;
  uchar *in_stack_fffffffffffffef0;
  CSHA256 *in_stack_fffffffffffffef8;
  int source_line;
  size_t in_stack_ffffffffffffff70;
  ConstevalFormatString<3U> in_stack_ffffffffffffff78;
  LogFlags LVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  LVar3 = in_RDI;
  CSHA256::CSHA256((CSHA256 *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  CuckooCache::cache<uint256,_SignatureCacheHasher>::cache(in_stack_fffffffffffffee8);
  SignatureCache::SignatureCache
            ((SignatureCache *)in_stack_ffffffffffffff78.fmt,in_stack_ffffffffffffff70);
  GetRandHash();
  puVar2 = base_blob<256U>::begin
                     ((base_blob<256U> *)
                      CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  source_line = (int)((ulong)puVar2 >> 0x20);
  CSHA256::Write(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                 (size_t)in_stack_fffffffffffffee8);
  base_blob<256U>::begin
            ((base_blob<256U> *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  CSHA256::Write(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                 (size_t)in_stack_fffffffffffffee8);
  CuckooCache::cache<uint256,_SignatureCacheHasher>::setup_bytes
            (in_stack_fffffffffffffee8,(size_t)in_stack_fffffffffffffee0);
  std::get<0ul,unsigned_int,unsigned_long>
            ((pair<unsigned_int,_unsigned_long> *)
             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  std::get<1ul,unsigned_int,unsigned_long>
            ((pair<unsigned_int,_unsigned_long> *)
             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffee8,
             in_stack_fffffffffffffee0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffee8,
             in_stack_fffffffffffffee0);
  logging_function._M_str = (char *)((ulong)in_RSI >> 0x14);
  logging_function._M_len = LVar3;
  source_file._M_str = in_RSI;
  source_file._M_len = in_RDX;
  LogPrintFormatInternal<unsigned_long,unsigned_long,unsigned_int>
            (logging_function,source_file,source_line,in_RDI,in_stack_00000070,
             in_stack_ffffffffffffff78,in_stack_00000080,in_stack_00000088,in_stack_00000090);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ValidationCache::ValidationCache(const size_t script_execution_cache_bytes, const size_t signature_cache_bytes)
    : m_signature_cache{signature_cache_bytes}
{
    // Setup the salted hasher
    uint256 nonce = GetRandHash();
    // We want the nonce to be 64 bytes long to force the hasher to process
    // this chunk, which makes later hash computations more efficient. We
    // just write our 32-byte entropy twice to fill the 64 bytes.
    m_script_execution_cache_hasher.Write(nonce.begin(), 32);
    m_script_execution_cache_hasher.Write(nonce.begin(), 32);

    const auto [num_elems, approx_size_bytes] = m_script_execution_cache.setup_bytes(script_execution_cache_bytes);
    LogPrintf("Using %zu MiB out of %zu MiB requested for script execution cache, able to store %zu elements\n",
              approx_size_bytes >> 20, script_execution_cache_bytes >> 20, num_elems);
}